

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall TPZManVector<Fad<double>,_20>::~TPZManVector(TPZManVector<Fad<double>,_20> *this)

{
  void *in_RDI;
  TPZManVector<Fad<double>,_20> *unaff_retaddr;
  
  ~TPZManVector(unaff_retaddr);
  operator_delete(in_RDI,0x2a0);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}